

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::debug::StackTrace::StackTraceEntry::StackTraceEntry
          (StackTraceEntry *this,size_t index,char *loc,char *demang,char *hex,char *addr)

{
  allocator local_69;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50 [32];
  
  (this->m_location)._M_dataplus._M_p = (pointer)&(this->m_location).field_2;
  (this->m_location)._M_string_length = 0;
  (this->m_location).field_2._M_local_buf[0] = '\0';
  (this->m_demangled)._M_dataplus._M_p = (pointer)&(this->m_demangled).field_2;
  (this->m_demangled)._M_string_length = 0;
  (this->m_demangled).field_2._M_local_buf[0] = '\0';
  (this->m_hex)._M_dataplus._M_p = (pointer)&(this->m_hex).field_2;
  (this->m_hex)._M_string_length = 0;
  local_60 = (string *)&this->m_demangled;
  (this->m_hex).field_2._M_local_buf[0] = '\0';
  (this->m_addr)._M_dataplus._M_p = (pointer)&(this->m_addr).field_2;
  (this->m_addr)._M_string_length = 0;
  local_68 = (string *)&this->m_hex;
  (this->m_addr).field_2._M_local_buf[0] = '\0';
  this->m_index = index;
  local_58 = &this->m_location;
  std::__cxx11::string::string(local_50,loc,&local_69);
  std::__cxx11::string::operator=((string *)&this->m_location,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_50,demang,&local_69);
  std::__cxx11::string::operator=(local_60,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_50,hex,&local_69);
  std::__cxx11::string::operator=(local_68,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_50,addr,&local_69);
  std::__cxx11::string::operator=((string *)&this->m_addr,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

StackTrace::StackTraceEntry::StackTraceEntry(std::size_t index, const char* loc, const char* demang, const char* hex,
    const char* addr) {
  m_index = index;
  m_location = std::string(loc);
  m_demangled = std::string(demang);
  m_hex = std::string(hex);
  m_addr = std::string(addr);
}